

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_utf.c
# Opt level: O2

wchar_t fl_utf8bytes(uint ucs)

{
  wchar_t wVar1;
  
  if (ucs < 0x80) {
    wVar1 = L'\x01';
  }
  else if (ucs < 0x800) {
    wVar1 = L'\x02';
  }
  else {
    if (0xffff < ucs) {
      return (uint)(ucs < 0x110000) + L'\x03';
    }
    wVar1 = L'\x03';
  }
  return wVar1;
}

Assistant:

int fl_utf8bytes(unsigned ucs) {
  if (ucs < 0x000080U) {
    return 1;
  } else if (ucs < 0x000800U) {
    return 2;
  } else if (ucs < 0x010000U) {
    return 3;
  } else if (ucs <= 0x10ffffU) {
    return 4;
  } else {
    return 3; /* length of the illegal character encoding */
  }
}